

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThread.h
# Opt level: O0

void __thiscall
xmrig::OclThread::OclThread
          (OclThread *this,uint32_t index,uint32_t intensity,uint32_t worksize,uint32_t stridedIndex
          ,uint32_t memChunk,uint32_t threads,uint32_t unrollFactor)

{
  value_type_conflict1 *__value;
  uint32_t in_ECX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  OclThread *in_RDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  uint in_stack_00000008;
  uint32_t in_stack_00000010;
  unsigned_long_long in_stack_ffffffffffffffa8;
  allocator_type *__a;
  bitset<2UL> *in_stack_ffffffffffffffb0;
  undefined1 *__n;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffc0;
  undefined1 local_29;
  undefined8 local_28;
  uint32_t local_1c;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t local_10;
  uint32_t local_c;
  
  in_RDI->m_datasetHost = false;
  in_RDI->m_gcnAsm = true;
  local_1c = in_R9D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::bitset<2UL>::bitset(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  __a = (allocator_type *)&in_RDI->m_threads;
  __value = (value_type_conflict1 *)(ulong)in_stack_00000008;
  local_28 = 0xffffffffffffffff;
  __n = &local_29;
  std::allocator<long>::allocator((allocator<long> *)0x208c45);
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_ffffffffffffffc0,(size_type)__n,__value,__a);
  std::allocator<long>::~allocator((allocator<long> *)0x208c6a);
  in_RDI->m_bfactor = 6;
  in_RDI->m_index = local_c;
  in_RDI->m_intensity = 0;
  in_RDI->m_memChunk = local_1c;
  in_RDI->m_stridedIndex = local_18;
  in_RDI->m_unrollFactor = in_stack_00000010;
  in_RDI->m_worksize = local_14;
  setIntensity(in_RDI,local_10);
  return;
}

Assistant:

OclThread(uint32_t index, uint32_t intensity, uint32_t worksize, uint32_t stridedIndex, uint32_t memChunk, uint32_t threads, uint32_t unrollFactor) :
        m_threads(threads, -1),
        m_index(index),
        m_memChunk(memChunk),
        m_stridedIndex(stridedIndex),
        m_unrollFactor(unrollFactor),
        m_worksize(worksize)
    {
        setIntensity(intensity);
    }